

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O0

DescriptorSet * __thiscall
Diligent::ShaderResourceCacheVk::GetDescriptorSet(ShaderResourceCacheVk *this,Uint32 Index)

{
  Char *Message;
  pointer pvVar1;
  undefined1 local_38 [8];
  string msg;
  Uint32 Index_local;
  ShaderResourceCacheVk *this_local;
  
  msg.field_2._12_4_ = Index;
  if (this->m_NumSets <= Index) {
    FormatString<char[26],char[18]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index < m_NumSets",(char (*) [18])(ulong)this->m_NumSets);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0xbf);
    std::__cxx11::string::~string((string *)local_38);
  }
  pvVar1 = std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::get
                     (&this->m_pMemory);
  return (DescriptorSet *)((long)pvVar1 + (ulong)(uint)msg.field_2._12_4_ * 0x30);
}

Assistant:

const DescriptorSet& GetDescriptorSet(Uint32 Index) const
    {
        VERIFY_EXPR(Index < m_NumSets);
        return reinterpret_cast<const DescriptorSet*>(m_pMemory.get())[Index];
    }